

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::ExpandRuleVariables(cmLocalGenerator *this,string *s,RuleVariables *replaceValues)

{
  cmTarget *target;
  int iVar1;
  ulong uVar2;
  long lVar3;
  char cVar4;
  string var;
  string expandedInput;
  string replace;
  string local_c0;
  string local_a0;
  cmLocalGenerator *local_80;
  RuleVariables *local_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_80 = this;
  local_78 = replaceValues;
  if (replaceValues->RuleLauncher != (char *)0x0) {
    target = replaceValues->CMTarget;
    std::__cxx11::string::string
              ((string *)&local_a0,replaceValues->RuleLauncher,(allocator *)&local_c0);
    InsertRuleLauncher(local_80,s,target,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
  }
  cVar4 = (char)s;
  uVar2 = std::__cxx11::string::find(cVar4,0x3c);
  if (uVar2 != 0xffffffffffffffff) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    do {
      if (s->_M_string_length - 2 <= uVar2) break;
      lVar3 = std::__cxx11::string::find(cVar4,0x3e);
      if (lVar3 == -1) goto LAB_002bd7da;
      iVar1 = isalpha((int)(s->_M_dataplus)._M_p[uVar2 + 1]);
      if (iVar1 == 0) {
        uVar2 = std::__cxx11::string::find(cVar4,0x3c);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_c0,(ulong)s);
        ExpandRuleVariable(&local_50,local_80,&local_c0,local_78);
        std::__cxx11::string::substr((ulong)local_70,(ulong)s);
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_70[0]);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_50._M_dataplus._M_p);
        uVar2 = std::__cxx11::string::find(cVar4,0x3c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
    } while (uVar2 != 0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)s);
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)s);
LAB_002bd7da:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void
cmLocalGenerator::ExpandRuleVariables(std::string& s,
                                      const RuleVariables& replaceValues)
{
  if(replaceValues.RuleLauncher)
    {
    this->InsertRuleLauncher(s, replaceValues.CMTarget,
                             replaceValues.RuleLauncher);
    }
  std::string::size_type start = s.find('<');
  // no variables to expand
  if(start == s.npos)
    {
    return;
    }
  std::string::size_type pos = 0;
  std::string expandedInput;
  while(start != s.npos && start < s.size()-2)
    {
    std::string::size_type end = s.find('>', start);
    // if we find a < with no > we are done
    if(end == s.npos)
      {
      return;
      }
    char c = s[start+1];
    // if the next char after the < is not A-Za-z then
    // skip it and try to find the next < in the string
    if(!isalpha(c))
      {
      start = s.find('<', start+1);
      }
    else
      {
      // extract the var
      std::string var = s.substr(start+1,  end - start-1);
      std::string replace = this->ExpandRuleVariable(var,
                                                     replaceValues);
      expandedInput += s.substr(pos, start-pos);
      expandedInput += replace;
      // move to next one
      start = s.find('<', start+var.size()+2);
      pos = end+1;
      }
    }
  // add the rest of the input
  expandedInput += s.substr(pos, s.size()-pos);
  s = expandedInput;
}